

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

parser_error parse_prefs_entry_renderer(parser *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  parser_error pVar3;
  char *pcVar4;
  char *label_colors;
  char *symbols;
  
  pcVar4 = parser_getsym(p,"name");
  wVar2 = ui_entry_renderer_lookup(pcVar4);
  if (wVar2 == L'\0') {
    pVar3 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    _Var1 = parser_hasval(p,"colors");
    if (_Var1) {
      pcVar4 = parser_getsym(p,"colors");
      if ((*pcVar4 == '*') && (pcVar4[1] == '\0')) {
        pcVar4 = (char *)0x0;
      }
    }
    else {
      pcVar4 = (char *)0x0;
    }
    _Var1 = parser_hasval(p,"labelcolors");
    if (_Var1) {
      label_colors = parser_getsym(p,"labelcolors");
      if ((*label_colors == '*') && (label_colors[1] == '\0')) {
        label_colors = (char *)0x0;
      }
    }
    else {
      label_colors = (char *)0x0;
    }
    _Var1 = parser_hasval(p,"symbols");
    if (_Var1) {
      symbols = parser_getsym(p,"symbols");
    }
    else {
      symbols = (char *)0x0;
    }
    wVar2 = ui_entry_renderer_customize(wVar2,pcVar4,label_colors,symbols);
    pVar3 = PARSE_ERROR_INVALID_VALUE;
    if (wVar2 == L'\0') {
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_prefs_entry_renderer(struct parser *p)
{
	const char* name = parser_getsym(p, "name");
	const char* colors;
	const char* label_colors;
	const char* symbols;
	int index;

	index = ui_entry_renderer_lookup(name);
	if (index == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	if (parser_hasval(p, "colors")) {
		colors = parser_getsym(p, "colors");
		if (streq(colors, "*")) {
			colors = NULL;
		}
	} else {
		colors = NULL;
	}
	if (parser_hasval(p, "labelcolors")) {
		label_colors = parser_getsym(p, "labelcolors");
		if (streq(label_colors, "*")) {
			label_colors = NULL;
		}
	} else {
		label_colors = NULL;
	}
	if (parser_hasval(p, "symbols")) {
		symbols = parser_getsym(p, "symbols");
	} else {
		symbols = NULL;
	}
	if (ui_entry_renderer_customize(index, colors, label_colors, symbols)) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	return PARSE_ERROR_NONE;
}